

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ResultClampingTestCase::testPolygonOffset
          (ResultClampingTestCase *this)

{
  ostringstream *poVar1;
  TestLog *log;
  RenderContext *pRVar2;
  TestContext *testCtx;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_35a;
  allocator<char> local_359;
  Surface referenceImage;
  Surface testImage;
  string local_328;
  string local_308;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  MessageBuilder local_288;
  ShaderProgram program;
  long lVar6;
  
  local_2b8 = 0x3f800000bf800000;
  uStack_2b0 = 0x3f8000003f800000;
  local_2a8 = 0x3f8000003f800000;
  uStack_2a0 = 0x3f8000003f800000;
  local_298 = 0xbf8000003f800000;
  uStack_290 = 0x3f8000003f800000;
  local_2e8 = 0xbf800000bf800000;
  uStack_2e0 = 0x3f800000bf800000;
  local_2d8 = 0x3f800000bf800000;
  uStack_2d0 = 0x3f800000bf800000;
  local_2c8 = 0xbf8000003f800000;
  uStack_2c0 = 0x3f800000bf800000;
  log = ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar3 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&testImage,iVar3,iVar3);
  iVar3 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&referenceImage,iVar3,iVar3);
  iVar3 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_359);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",
             &local_35a);
  glu::makeVtxFragSources((ProgramSources *)&local_288,&local_308,&local_328);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)&local_288);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&local_288);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  uVar4 = (**(code **)(lVar6 + 0x780))(program.m_program.m_program,"a_position");
  uVar5 = (**(code **)(lVar6 + 0x780))(program.m_program.m_program,"a_color");
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar6 + 0x1d0))(0x3f800000);
    (**(code **)(lVar6 + 0x188))(0x4100);
    (**(code **)(lVar6 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar6 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar6 + 0x5e0))(0xb71);
    (**(code **)(lVar6 + 0x5e0))(0x8037);
    (**(code **)(lVar6 + 0x610))(uVar4);
    poVar1 = &local_288.m_str;
    local_288.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.");
    tcu::MessageBuilder::operator<<(&local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0,&local_2b8);
    poVar1 = &local_288.m_str;
    local_288.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw bottom-right. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 8), Polygon Z = 1.0. (Result depth should clamp to 1.0)."
                   );
    tcu::MessageBuilder::operator<<(&local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar6 + 0x4a0))(0x207);
    (**(code **)(lVar6 + 0x1028))(0,0x41000000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    poVar1 = &local_288.m_str;
    local_288.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw bottom-right. Color = Red.\tState: DepthFunc = GREATER, PolygonOffset(0, 9), Polygon Z = 1.0. (Result depth should clamp to 1.0 too)"
                   );
    tcu::MessageBuilder::operator<<(&local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar6 + 0x4a0))(0x204);
    (**(code **)(lVar6 + 0x1028))(0,0x41100000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0,&local_2e8);
    poVar1 = &local_288.m_str;
    local_288.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw top-left. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, -8), Polygon Z = -1.0. (Result depth should clamp to -1.0)"
                   );
    tcu::MessageBuilder::operator<<(&local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar6 + 0x4a0))(0x207);
    (**(code **)(lVar6 + 0x1028))(0,0xc1000000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    poVar1 = &local_288.m_str;
    local_288.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw top-left. Color = Yellow.\tState: DepthFunc = LESS, PolygonOffset(0, -9), Polygon Z = -1.0. (Result depth should clamp to -1.0 too)."
                   );
    tcu::MessageBuilder::operator<<(&local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar6 + 0x4a0))(0x201);
    (**(code **)(lVar6 + 0x1028))(0,0xc1100000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0x3f800000,0,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    (**(code **)(lVar6 + 0x518))(uVar4);
    (**(code **)(lVar6 + 0x1680))(0);
    (**(code **)(lVar6 + 0x648))();
    pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_288,&testImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&local_288);
    glu::ShaderProgram::~ShaderProgram(&program);
    poVar1 = &local_288.m_str;
    local_288.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Expecting: Top-left = White, Bottom-right = White.");
    tcu::MessageBuilder::operator<<(&local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_288,&referenceImage);
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f8000003f800000;
    tcu::clear((PixelBufferAccess *)&local_288,(Vec4 *)&program);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_288,&testImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&referenceImage);
    verifyImages(log,testCtx,pRVar2,(ConstPixelBufferAccess *)&local_288,
                 (ConstPixelBufferAccess *)&program);
    tcu::Surface::~Surface(&referenceImage);
    tcu::Surface::~Surface(&testImage);
    return;
  }
  glu::operator<<(log,&program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x304);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ResultClampingTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangleBottomRight[] =
	{
		tcu::Vec4(-1,  1,  1,  1),
		tcu::Vec4( 1,  1,  1,  1),
		tcu::Vec4( 1, -1,  1,  1),
	};
	const tcu::Vec4 triangleTopLeft[] =
	{
		tcu::Vec4(-1, -1, -1,  1),
		tcu::Vec4(-1,  1, -1,  1),
		tcu::Vec4( 1, -1, -1,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		//draw bottom right (far)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleBottomRight);

			log << TestLog::Message << "Draw bottom-right. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 8), Polygon Z = 1.0. (Result depth should clamp to 1.0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 8);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw bottom-right. Color = Red.\tState: DepthFunc = GREATER, PolygonOffset(0, 9), Polygon Z = 1.0. (Result depth should clamp to 1.0 too)" << TestLog::EndMessage;

			gl.depthFunc				(GL_GREATER);
			gl.polygonOffset			(0, 9);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		//draw top left (near)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleTopLeft);

			log << TestLog::Message << "Draw top-left. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, -8), Polygon Z = -1.0. (Result depth should clamp to -1.0)" << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, -8);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw top-left. Color = Yellow.\tState: DepthFunc = LESS, PolygonOffset(0, -9), Polygon Z = -1.0. (Result depth should clamp to -1.0 too)." << TestLog::EndMessage;

			gl.depthFunc				(GL_LESS);
			gl.polygonOffset			(0, -9);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting: Top-left = White, Bottom-right = White." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}